

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

void iniparser_dump_ini(dictionary *d,FILE *f)

{
  int iVar1;
  char *s;
  long lVar2;
  int n;
  
  if (f != (FILE *)0x0 && d != (dictionary *)0x0) {
    iVar1 = iniparser_getnsec(d);
    if (0 < iVar1) {
      for (n = 0; iVar1 != n; n = n + 1) {
        s = iniparser_getsecname(d,n);
        iniparser_dumpsection_ini(d,s,f);
      }
      fputc(10,(FILE *)f);
      return;
    }
    for (lVar2 = 0; lVar2 < d->size; lVar2 = lVar2 + 1) {
      if (d->key[lVar2] != (char *)0x0) {
        fprintf((FILE *)f,"%s = %s\n",d->key[lVar2],d->val[lVar2]);
      }
    }
  }
  return;
}

Assistant:

void iniparser_dump_ini(const dictionary * d, FILE * f)
{
    int          i ;
    int          nsec ;
    const char * secname ;

    if (d == NULL || f == NULL) return ;

    nsec = iniparser_getnsec(d);
    if (nsec < 1) {
        /* No section in file: dump all keys as they are */
        for (i = 0 ; i < d->size ; i++) {
            if (d->key[i] == NULL)
                continue ;
            fprintf(f, "%s = %s\n", d->key[i], d->val[i]);
        }
        return ;
    }
    for (i = 0 ; i < nsec ; i++) {
        secname = iniparser_getsecname(d, i) ;
        iniparser_dumpsection_ini(d, secname, f);
    }
    fprintf(f, "\n");
    return ;
}